

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tableref.cpp
# Opt level: O2

unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>,_true> __thiscall
duckdb::AtClause::Deserialize(AtClause *this,Deserializer *deserializer)

{
  AtClause *this_00;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_60;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> unit;
  undefined1 local_30 [32];
  
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>(&unit,deserializer,1,"unit");
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((Deserializer *)local_58,(field_id_t)deserializer,(char *)0x2);
  this_00 = (AtClause *)operator_new(0x28);
  local_30._8_8_ = unit._M_string_length;
  local_30._0_8_ = local_30 + 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)unit._M_dataplus._M_p == &unit.field_2) {
    local_30._24_8_ = unit.field_2._8_8_;
  }
  else {
    local_30._0_8_ = unit._M_dataplus._M_p;
  }
  unit._M_string_length = 0;
  unit.field_2._M_local_buf[0] = '\0';
  local_60._M_head_impl = (ParsedExpression *)local_58;
  local_58 = (undefined1  [8])0x0;
  unit._M_dataplus._M_p = (pointer)&unit.field_2;
  AtClause(this_00,(string *)local_30,
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            *)&local_60);
  (this->unit)._M_dataplus._M_p = (pointer)this_00;
  if (local_60._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_60._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_60._M_head_impl = (ParsedExpression *)0x0;
  ::std::__cxx11::string::~string((string *)local_30);
  if (local_58 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_58 + 8))();
  }
  ::std::__cxx11::string::~string((string *)&unit);
  return (unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>)
         (unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>)this;
}

Assistant:

unique_ptr<AtClause> AtClause::Deserialize(Deserializer &deserializer) {
	auto unit = deserializer.ReadPropertyWithDefault<string>(1, "unit");
	auto expr = deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(2, "expr");
	auto result = duckdb::unique_ptr<AtClause>(new AtClause(std::move(unit), std::move(expr)));
	return result;
}